

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flattening.cpp
# Opt level: O2

Literal * Shell::Flattening::flatten(Literal *l)

{
  TermList ts;
  TermList elem;
  bool bVar1;
  anon_union_8_2_f154dc0f_for_Term_10 *paVar2;
  TermList argument;
  Stack<Kernel::TermList> local_48;
  
  if (((l->super_Term)._args[0]._content & 8) == 0) {
    local_48._cursor = (TermList *)0x0;
    local_48._end = (TermList *)0x0;
    local_48._capacity = 0;
    local_48._stack = (TermList *)0x0;
    paVar2 = (anon_union_8_2_f154dc0f_for_Term_10 *)
             ((l->super_Term)._args + (*(uint *)&(l->super_Term).field_0xc & 0xfffffff));
    bVar1 = false;
    while (ts._content = (paVar2->_sort)._content, ((uint)ts._content & 3) != 2) {
      elem = flatten(ts);
      paVar2 = paVar2 + -1;
      bVar1 = (bool)(bVar1 | ts._content != elem._content);
      Lib::Stack<Kernel::TermList>::push(&local_48,elem);
    }
    if (bVar1) {
      l = Kernel::Literal::create(l,local_48._stack);
    }
    Lib::Stack<Kernel::TermList>::~Stack(&local_48);
  }
  return l;
}

Assistant:

Literal* Flattening::flatten(Literal* l)
{
  if (l->shared()) {
    return l;
  }

  bool flattened = false;
  Stack<TermList> args;
  Term::Iterator terms(l);
  while (terms.hasNext()) {
    TermList argument = terms.next();
    TermList flattenedArgument = flatten(argument);
    if (argument != flattenedArgument) {
      flattened = true;
    }
    args.push(flattenedArgument);
  }

  if (!flattened) {
    return l;
  }

  return Literal::create(l, args.begin());
}